

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

string * returnUngapped(string *input_sequence,string *consensus_structure)

{
  char x_00;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  undefined1 *puVar5;
  ostream *this;
  __tuple_element_t<1UL,_tuple<char,_int>_> *p_Var6;
  string *in_RDX;
  ulong in_RSI;
  string *in_RDI;
  bool close_1;
  tuple<char,_int> x_1;
  int i_2;
  int i_1;
  bool close;
  tuple<char,_int> x;
  int i;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> lts;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> cb;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> sb;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> paren;
  int length;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *in_stack_fffffffffffffc38;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *in_stack_fffffffffffffc50;
  iterator in_stack_fffffffffffffc58;
  int local_148;
  int local_144;
  int local_84;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> local_80;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> local_68;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> local_50;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> local_38;
  int local_1c;
  
  local_1c = std::__cxx11::string::length();
  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::vector
            ((vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)0x12d7b6);
  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::vector
            ((vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)0x12d7c3);
  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::vector
            ((vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)0x12d7d0);
  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::vector
            ((vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)0x12d7dd);
  for (local_84 = 0; local_84 < local_1c; local_84 = local_84 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
    if (*pcVar3 == '(') {
      std::__cxx11::string::operator[]((ulong)in_RDX);
      std::make_tuple<char&,int&>
                ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                 (int *)in_stack_fffffffffffffc40);
      std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::push_back
                (in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
      if (*pcVar3 == '<') {
        std::__cxx11::string::operator[]((ulong)in_RDX);
        std::make_tuple<char&,int&>
                  ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (int *)in_stack_fffffffffffffc40);
        std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::push_back
                  (in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
        if (*pcVar3 == '[') {
          std::__cxx11::string::operator[]((ulong)in_RDX);
          std::make_tuple<char&,int&>
                    ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     (int *)in_stack_fffffffffffffc40);
          std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::push_back
                    (in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
          if (*pcVar3 == '{') {
            std::__cxx11::string::operator[]((ulong)in_RDX);
            std::make_tuple<char&,int&>
                      ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                       (int *)in_stack_fffffffffffffc40);
            std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::push_back
                      (in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
          }
          else {
            std::tuple<char,_int>::tuple<true,_true>((tuple<char,_int> *)0x12da84);
            bVar2 = false;
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
            if ((*pcVar3 != ')') ||
               (bVar1 = std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                        ::empty(in_stack_fffffffffffffc50), bVar1)) {
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
              if ((*pcVar3 != '>') ||
                 (bVar1 = std::
                          vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                          empty(in_stack_fffffffffffffc50), bVar1)) {
                pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
                if ((*pcVar3 != ']') ||
                   (bVar1 = std::
                            vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                            empty(in_stack_fffffffffffffc50), bVar1)) {
                  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
                  if ((*pcVar3 == '}') &&
                     (bVar1 = std::
                              vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                              ::empty(in_stack_fffffffffffffc50), !bVar1)) {
                    sVar4 = std::
                            vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                            size(&local_68);
                    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                    operator[](&local_68,sVar4 - 1);
                    std::tuple<char,_int>::operator=
                              ((tuple<char,_int> *)in_stack_fffffffffffffc40,
                               (type)in_stack_fffffffffffffc38);
                    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                    begin(in_stack_fffffffffffffc38);
                    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                    size(&local_68);
                    __gnu_cxx::
                    __normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                    ::operator+((__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                (difference_type)in_stack_fffffffffffffc40);
                    __gnu_cxx::
                    __normal_iterator<std::tuple<char,int>const*,std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>>
                    ::__normal_iterator<std::tuple<char,int>*>
                              ((__normal_iterator<const_std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                                *)in_stack_fffffffffffffc40,
                               (__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                                *)in_stack_fffffffffffffc38);
                    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                    erase(in_stack_fffffffffffffc50,
                          (const_iterator)in_stack_fffffffffffffc58._M_current);
                    bVar2 = true;
                  }
                }
                else {
                  sVar4 = std::
                          vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                          size(&local_50);
                  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                  operator[](&local_50,sVar4 - 1);
                  std::tuple<char,_int>::operator=
                            ((tuple<char,_int> *)in_stack_fffffffffffffc40,
                             (type)in_stack_fffffffffffffc38);
                  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::begin
                            (in_stack_fffffffffffffc38);
                  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::size
                            (&local_50);
                  __gnu_cxx::
                  __normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                  ::operator+((__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                              (difference_type)in_stack_fffffffffffffc40);
                  __gnu_cxx::
                  __normal_iterator<std::tuple<char,int>const*,std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>>
                  ::__normal_iterator<std::tuple<char,int>*>
                            ((__normal_iterator<const_std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                              *)in_stack_fffffffffffffc40,
                             (__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                              *)in_stack_fffffffffffffc38);
                  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                            (in_stack_fffffffffffffc50,
                             (const_iterator)in_stack_fffffffffffffc58._M_current);
                  bVar2 = true;
                }
              }
              else {
                sVar4 = std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                        ::size(&local_80);
                std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                operator[](&local_80,sVar4 - 1);
                std::tuple<char,_int>::operator=
                          ((tuple<char,_int> *)in_stack_fffffffffffffc40,
                           (type)in_stack_fffffffffffffc38);
                std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::begin
                          (in_stack_fffffffffffffc38);
                std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::size
                          (&local_80);
                __gnu_cxx::
                __normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                ::operator+((__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                            (difference_type)in_stack_fffffffffffffc40);
                __gnu_cxx::
                __normal_iterator<std::tuple<char,int>const*,std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>>
                ::__normal_iterator<std::tuple<char,int>*>
                          ((__normal_iterator<const_std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                            *)in_stack_fffffffffffffc40,
                           (__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                            *)in_stack_fffffffffffffc38);
                std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                          (in_stack_fffffffffffffc50,
                           (const_iterator)in_stack_fffffffffffffc58._M_current);
                bVar2 = true;
              }
            }
            else {
              sVar4 = std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                      size(&local_38);
              std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
              operator[](&local_38,sVar4 - 1);
              std::tuple<char,_int>::operator=
                        ((tuple<char,_int> *)in_stack_fffffffffffffc40,
                         (type)in_stack_fffffffffffffc38);
              std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::begin
                        (in_stack_fffffffffffffc38);
              std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::size
                        (&local_38);
              __gnu_cxx::
              __normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
              ::operator+((__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                          (difference_type)in_stack_fffffffffffffc40);
              __gnu_cxx::
              __normal_iterator<std::tuple<char,int>const*,std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>>
              ::__normal_iterator<std::tuple<char,int>*>
                        ((__normal_iterator<const_std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                          *)in_stack_fffffffffffffc40,
                         (__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                          *)in_stack_fffffffffffffc38);
              std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                        (in_stack_fffffffffffffc50,
                         (const_iterator)in_stack_fffffffffffffc58._M_current);
              bVar2 = true;
            }
            if (bVar2) {
              pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
              x_00 = *pcVar3;
              std::get<1ul,char,int>((tuple<char,_int> *)0x12df10);
              pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
              bVar2 = canMatch(x_00,*pcVar3);
              if (!bVar2) {
                pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
                if (*pcVar3 == '-') {
                  std::get<1ul,char,int>((tuple<char,_int> *)0x12df9b);
                  puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDX);
                  *puVar5 = 0x2e;
                }
                else {
                  std::get<1ul,char,int>((tuple<char,_int> *)0x12dfd2);
                  pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
                  if (*pcVar3 == '-') {
                    puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDX);
                    *puVar5 = 0x2e;
                  }
                  else {
                    puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDX);
                    *puVar5 = 0x2e;
                    std::get<1ul,char,int>((tuple<char,_int> *)0x12e05f);
                    puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDX);
                    *puVar5 = 0x2e;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar2 = std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::empty
                    (in_stack_fffffffffffffc50);
  if ((((bVar2) &&
       (bVar2 = std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::empty
                          (in_stack_fffffffffffffc50), bVar2)) &&
      (bVar2 = std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::empty
                         (in_stack_fffffffffffffc50), bVar2)) &&
     (bVar2 = std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::empty
                        (in_stack_fffffffffffffc50), bVar2)) {
    local_144 = std::__cxx11::string::length();
    while (local_144 = local_144 + -1, -1 < local_144) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
      if (*pcVar3 == '-') {
        std::__cxx11::string::erase((ulong)in_RDX,(long)local_144);
      }
    }
    for (local_148 = 0; local_148 < local_1c; local_148 = local_148 + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
      if (*pcVar3 == '(') {
        std::__cxx11::string::operator[]((ulong)in_RDX);
        std::make_tuple<char&,int&>
                  ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (int *)in_stack_fffffffffffffc40);
        std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::push_back
                  (in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
        if (*pcVar3 == '<') {
          std::__cxx11::string::operator[]((ulong)in_RDX);
          std::make_tuple<char&,int&>
                    ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     (int *)in_stack_fffffffffffffc40);
          std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::push_back
                    (in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
          if (*pcVar3 == '[') {
            std::__cxx11::string::operator[]((ulong)in_RDX);
            std::make_tuple<char&,int&>
                      ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                       (int *)in_stack_fffffffffffffc40);
            std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::push_back
                      (in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
          }
          else {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
            if (*pcVar3 == '{') {
              std::__cxx11::string::operator[]((ulong)in_RDX);
              std::make_tuple<char&,int&>
                        ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                         (int *)in_stack_fffffffffffffc40);
              std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::push_back
                        (in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
            }
            else {
              std::tuple<char,_int>::tuple<true,_true>((tuple<char,_int> *)0x12e3f6);
              bVar2 = false;
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
              if ((*pcVar3 != ')') ||
                 (bVar1 = std::
                          vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                          empty(in_stack_fffffffffffffc50), bVar1)) {
                pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
                if ((*pcVar3 != '>') ||
                   (bVar1 = std::
                            vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                            empty(in_stack_fffffffffffffc50), bVar1)) {
                  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
                  if ((*pcVar3 != ']') ||
                     (bVar1 = std::
                              vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                              ::empty(in_stack_fffffffffffffc50), bVar1)) {
                    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
                    if ((*pcVar3 == '}') &&
                       (bVar1 = std::
                                vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                                ::empty(in_stack_fffffffffffffc50), !bVar1)) {
                      in_stack_fffffffffffffc50 = &local_68;
                      sVar4 = std::
                              vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                              ::size(in_stack_fffffffffffffc50);
                      std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                      operator[](in_stack_fffffffffffffc50,sVar4 - 1);
                      std::tuple<char,_int>::operator=
                                ((tuple<char,_int> *)in_stack_fffffffffffffc40,
                                 (type)in_stack_fffffffffffffc38);
                      std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                      begin(in_stack_fffffffffffffc38);
                      std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                      size(in_stack_fffffffffffffc50);
                      __gnu_cxx::
                      __normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                      ::operator+((__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                  (difference_type)in_stack_fffffffffffffc40);
                      __gnu_cxx::
                      __normal_iterator<std::tuple<char,int>const*,std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>>
                      ::__normal_iterator<std::tuple<char,int>*>
                                ((__normal_iterator<const_std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                                  *)in_stack_fffffffffffffc40,
                                 (__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                                  *)in_stack_fffffffffffffc38);
                      in_stack_fffffffffffffc58 =
                           std::
                           vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                           erase(in_stack_fffffffffffffc50,
                                 (const_iterator)in_stack_fffffffffffffc58._M_current);
                      bVar2 = true;
                    }
                  }
                  else {
                    sVar4 = std::
                            vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                            size(&local_50);
                    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                    operator[](&local_50,sVar4 - 1);
                    std::tuple<char,_int>::operator=
                              ((tuple<char,_int> *)in_stack_fffffffffffffc40,
                               (type)in_stack_fffffffffffffc38);
                    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                    begin(in_stack_fffffffffffffc38);
                    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                    size(&local_50);
                    __gnu_cxx::
                    __normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                    ::operator+((__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                (difference_type)in_stack_fffffffffffffc40);
                    __gnu_cxx::
                    __normal_iterator<std::tuple<char,int>const*,std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>>
                    ::__normal_iterator<std::tuple<char,int>*>
                              ((__normal_iterator<const_std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                                *)in_stack_fffffffffffffc40,
                               (__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                                *)in_stack_fffffffffffffc38);
                    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                    erase(in_stack_fffffffffffffc50,
                          (const_iterator)in_stack_fffffffffffffc58._M_current);
                    bVar2 = true;
                  }
                }
                else {
                  sVar4 = std::
                          vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                          size(&local_80);
                  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                  operator[](&local_80,sVar4 - 1);
                  std::tuple<char,_int>::operator=
                            ((tuple<char,_int> *)in_stack_fffffffffffffc40,
                             (type)in_stack_fffffffffffffc38);
                  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::begin
                            (in_stack_fffffffffffffc38);
                  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::size
                            (&local_80);
                  __gnu_cxx::
                  __normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                  ::operator+((__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                              (difference_type)in_stack_fffffffffffffc40);
                  __gnu_cxx::
                  __normal_iterator<std::tuple<char,int>const*,std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>>
                  ::__normal_iterator<std::tuple<char,int>*>
                            ((__normal_iterator<const_std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                              *)in_stack_fffffffffffffc40,
                             (__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                              *)in_stack_fffffffffffffc38);
                  std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                            (in_stack_fffffffffffffc50,
                             (const_iterator)in_stack_fffffffffffffc58._M_current);
                  bVar2 = true;
                }
              }
              else {
                sVar4 = std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                        ::size(&local_38);
                std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
                operator[](&local_38,sVar4 - 1);
                std::tuple<char,_int>::operator=
                          ((tuple<char,_int> *)in_stack_fffffffffffffc40,
                           (type)in_stack_fffffffffffffc38);
                std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::begin
                          (in_stack_fffffffffffffc38);
                std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::size
                          (&local_38);
                __gnu_cxx::
                __normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                ::operator+((__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                            (difference_type)in_stack_fffffffffffffc40);
                __gnu_cxx::
                __normal_iterator<std::tuple<char,int>const*,std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>>
                ::__normal_iterator<std::tuple<char,int>*>
                          ((__normal_iterator<const_std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                            *)in_stack_fffffffffffffc40,
                           (__normal_iterator<std::tuple<char,_int>_*,_std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>_>
                            *)in_stack_fffffffffffffc38);
                std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                          (in_stack_fffffffffffffc50,
                           (const_iterator)in_stack_fffffffffffffc58._M_current);
                bVar2 = true;
              }
              if ((bVar2) &&
                 (in_stack_fffffffffffffc4c = local_148,
                 p_Var6 = std::get<1ul,char,int>((tuple<char,_int> *)0x12e7ed),
                 in_stack_fffffffffffffc4c - *p_Var6 < 4)) {
                in_stack_fffffffffffffc40 =
                     (vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)
                     std::__cxx11::string::operator[]((ulong)in_RDX);
                *(undefined1 *)
                 &(in_stack_fffffffffffffc40->
                  super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_start = 0x2e;
                std::get<1ul,char,int>((tuple<char,_int> *)0x12e82c);
                in_stack_fffffffffffffc38 =
                     (vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)
                     std::__cxx11::string::operator[]((ulong)in_RDX);
                *(undefined1 *)
                 &(in_stack_fffffffffffffc38->
                  super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_start = 0x2e;
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::string((string *)in_RDI,in_RDX);
    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::~vector
              (in_stack_fffffffffffffc50);
    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::~vector
              (in_stack_fffffffffffffc50);
    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::~vector
              (in_stack_fffffffffffffc50);
    std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::~vector
              (in_stack_fffffffffffffc50);
    return in_RDI;
  }
  this = std::operator<<((ostream *)&std::cout,
                         "Error in reported structure. More left pairings than right pairings");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

std::string returnUngapped(std::string input_sequence, std::string consensus_structure){
    int length = consensus_structure.length();

    std::vector<std::tuple<char,int> > paren;
    std::vector<std::tuple<char,int> > sb;
    std::vector<std::tuple<char,int> > cb;
    std::vector<std::tuple<char,int> > lts;
    for(int i=0;i<length;i++){
        if(consensus_structure[i] == '(') {
            paren.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '<') {
            lts.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '[') {
            sb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '{') {
            cb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        std::tuple<char,int> x;
        bool close = false;
        if (consensus_structure[i] == ')' && !paren.empty()){
            x = paren[paren.size()-1];
            paren.erase(paren.begin()+(paren.size()-1));
            close = true;

        }
        else if (consensus_structure[i] == '>' && !lts.empty()){
            x = lts[lts.size()-1];
            lts.erase(lts.begin()+(lts.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == ']' && !sb.empty()){
            x = sb[sb.size()-1];
            sb.erase(sb.begin()+(sb.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == '}' && !cb.empty()){
            x = cb[cb.size()-1];
            cb.erase(cb.begin()+(cb.size()-1));
            close = true;
        }
            
        // Checks to see if the pair can match
        if(close){
            if(canMatch(input_sequence[i],input_sequence[std::get<1>(x)])){
                
                continue;
            }
            else{
                if(input_sequence[i] == '-'){
                    consensus_structure[std::get<1>(x)] = '.';
                    continue;
                }else if(input_sequence[std::get<1>(x)] == '-'){
                    consensus_structure[i] = '.';
                    continue;   
                }
                else{
                    consensus_structure[i] = '.';
                    consensus_structure[std::get<1>(x)] = '.';
                    continue;
                }
            }
        }    
    }
    // Reports if not all pairs were closed
    if(!paren.empty() || !lts.empty() || !sb.empty() || !cb.empty()){
        std::cout << "Error in reported structure. More left pairings than right pairings" << std::endl;
        exit(0); 
    }
    // Erase Gaps
    for(int i= input_sequence.length()-1; i>=0;--i){
        if(input_sequence[i] == '-') consensus_structure.erase(i,1);
    }

    // Checks for pairs less than 3 distance away
    for(int i=0;i<length;i++){
        if(consensus_structure[i] == '(') {
            paren.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '<') {
            lts.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '[') {
            sb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '{') {
            cb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        std::tuple<char,int> x;
        bool close = false;
        if (consensus_structure[i] == ')' && !paren.empty()){
            x = paren[paren.size()-1];
            paren.erase(paren.begin()+(paren.size()-1));
            close = true;

        }
        else if (consensus_structure[i] == '>' && !lts.empty()){
            x = lts[lts.size()-1];
            lts.erase(lts.begin()+(lts.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == ']' && !sb.empty()){
            x = sb[sb.size()-1];
            sb.erase(sb.begin()+(sb.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == '}' && !cb.empty()){
            x = cb[cb.size()-1];
            cb.erase(cb.begin()+(cb.size()-1));
            close = true;
        }
            
        if(close){
            if(i-std::get<1>(x) < 4){
                consensus_structure[i] = '.';
                consensus_structure[std::get<1>(x)] = '.';
                continue;  
            }
        }
    }

return consensus_structure;

}